

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<QDockWidget_*> * __thiscall QMainWindowTabBar::dockWidgets(QMainWindowTabBar *this)

{
  int iVar1;
  QList<QDockWidget_*> *in_RDI;
  QDockWidget *dock;
  int i;
  QList<QDockWidget_*> *docks;
  parameter_type in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  QDockWidget *in_stack_ffffffffffffffe0;
  int index;
  int iVar2;
  int iVar3;
  uint3 in_stack_ffffffffffffffec;
  uint uVar4;
  
  uVar4 = (uint)in_stack_ffffffffffffffec;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QDockWidget_*>::QList((QList<QDockWidget_*> *)0x5f73f3);
  iVar2 = 0;
  while( true ) {
    index = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
    iVar3 = iVar2;
    iVar1 = QTabBar::count((QTabBar *)CONCAT44(iVar2,in_stack_ffffffffffffffc0));
    if (iVar1 <= iVar2) break;
    in_stack_ffffffffffffffe0 = dockAt((QMainWindowTabBar *)CONCAT44(uVar4,iVar3),index);
    if (in_stack_ffffffffffffffe0 != (QDockWidget *)0x0) {
      QList<QDockWidget_*>::operator<<
                ((QList<QDockWidget_*> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8);
    }
    iVar2 = iVar3 + 1;
  }
  return in_RDI;
}

Assistant:

QList<QDockWidget *> QMainWindowTabBar::dockWidgets() const
{
    QList<QDockWidget *> docks;
    for (int i = 0; i < count(); ++i) {
        if (QDockWidget *dock = dockAt(i))
            docks << dock;
    }
    return docks;
}